

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

string * Appending(string *__return_storage_ptr__,string *FileName)

{
  char cVar1;
  ifstream ResultReader;
  undefined1 auStack_228 [8];
  long local_220 [4];
  byte abStack_200 [488];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::ifstream::ifstream(local_220,(string *)FileName,_S_in);
  while ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) == 0) {
    cVar1 = std::ios::widen((char)auStack_228 + (char)*(long *)(local_220[0] + -0x18) + '\b');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_220,(string *)__return_storage_ptr__,cVar1);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::string Appending(std::string FileName)
{
    std::string Results;
    std::ifstream ResultReader(FileName);
    while(ResultReader)
    {
        std::getline(ResultReader, Results);
        Results.push_back('\n');
    }
    return Results;
}